

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O1

void do_call(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA **ppCVar1;
  short sVar2;
  short sVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  CClass *pCVar10;
  undefined7 uVar12;
  CHAR_DATA *victim;
  CHAR_DATA *pCVar11;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  string_view fmt;
  int sn;
  int where;
  char arg2 [4608];
  char arg1 [4608];
  char buf [4608];
  uint local_3654;
  undefined8 local_3650;
  CHAR_DATA local_3644 [5];
  char local_2438 [4608];
  char local_1238 [4616];
  
  bVar5 = is_npc(ch);
  if ((bVar5) && (ch->desc == (DESCRIPTOR_DATA *)0x0)) {
    return;
  }
  target_name = one_argument(argument,local_2438);
  one_argument(target_name,(char *)((long)&local_3644[0].next_in_room + 4));
  if (local_2438[0] == '\0') {
    pcVar14 = "Call which what where?\n\r";
    goto LAB_002da025;
  }
  local_3654 = find_spell(ch,local_2438);
  if (((((int)local_3654 < 1) || (skill_table[local_3654].spell_fun == spell_null)) ||
      ((bVar5 = is_npc(ch), !bVar5 && (iVar6 = get_skill(ch,local_3654), iVar6 < 5)))) ||
     ((bVar5 = is_npc(ch), !bVar5 && (ch->pcdata->learned[(int)local_3654] == 0)))) {
    pcVar14 = "You don\'t know any powers of that name.\n\r";
    goto LAB_002da025;
  }
  if ((ch->position < skill_table[(int)local_3654].minimum_position) &&
     (iVar6 = get_trust(ch), iVar6 < 0x3b)) {
    pcVar14 = "You can\'t concentrate enough.\n\r";
    goto LAB_002da025;
  }
  if ((skill_table[(int)local_3654].ctype != 3) && (bVar5 = is_immortal(ch), !bVar5)) {
    pcVar14 = "You can\'t call that.\n\r";
    goto LAB_002da025;
  }
  bVar5 = cabal_down(ch,(int)ch->cabal);
  if (bVar5) {
    return;
  }
  sVar2 = ch->level;
  lVar15 = (long)(int)local_3654;
  pCVar10 = ch->my_class;
  if ((pCVar10 == (CClass *)0x0) &&
     ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
      (pCVar10 = ch->pIndexData->my_class, pCVar10 == (CClass *)0x0)))) {
    pCVar10 = CClass::GetClass(0);
  }
  iVar6 = CClass::GetIndex(pCVar10);
  uVar13 = 0x32;
  if (sVar2 + 2 != (int)*(short *)(lVar15 * 0x60 + 0x45a788 + (long)iVar6 * 2)) {
    lVar15 = (long)(int)local_3654;
    sVar2 = skill_table[lVar15].min_mana;
    sVar3 = ch->level;
    pCVar10 = char_data::Class(ch);
    iVar6 = CClass::GetIndex(pCVar10);
    uVar4 = 100 / (long)(((int)sVar3 - (int)*(short *)(lVar15 * 0x60 + 0x45a788 + (long)iVar6 * 2))
                        + 2);
    uVar13 = (ulong)(uint)(int)sVar2;
    if ((int)sVar2 < (int)uVar4) {
      uVar13 = uVar4 & 0xffffffff;
    }
  }
  uVar12 = (undefined7)
           ((ulong)((long)&switchD_002da152::switchdataD_003b42e0 +
                   (long)(int)(&switchD_002da152::switchdataD_003b42e0)
                              [(ushort)skill_table[(int)local_3654].target]) >> 8);
  pCVar11 = ch;
  switch(skill_table[(int)local_3654].target) {
  case 0:
    local_3650 = CONCAT71(uVar12,1);
    pCVar11 = (CHAR_DATA *)0x0;
    iVar6 = 3;
    goto LAB_002da2d1;
  case 1:
  case 9:
    if (local_3644[0].next_in_room._4_1_ == '\0') {
      victim = ch->fighting;
      if (victim == (CHAR_DATA *)0x0) {
        pcVar14 = "Call the power on whom?\n\r";
        goto LAB_002da025;
      }
    }
    else {
      victim = get_char_room(ch,target_name);
      if (victim == (CHAR_DATA *)0x0) {
LAB_002da35a:
        pcVar14 = "They aren\'t here.\n\r";
        goto LAB_002da025;
      }
    }
    bVar5 = is_affected_by(ch,0x12);
    if (bVar5) {
      local_3650 = 0;
      iVar6 = 0;
      pCVar11 = victim;
      if (ch->master == victim) {
        pcVar14 = "You can\'t do that on your own master.\n\r";
        goto LAB_002da025;
      }
    }
    else {
LAB_002da346:
      local_3650 = 0;
      iVar6 = 0;
      pCVar11 = victim;
    }
    break;
  case 2:
    if (local_3644[0].next_in_room._4_1_ != '\0') {
      victim = get_char_room(ch,target_name);
      if (victim == (CHAR_DATA *)0x0) goto LAB_002da35a;
      goto LAB_002da346;
    }
    local_3650 = 0;
    iVar6 = 0;
    victim = ch;
    break;
  case 3:
    if ((local_3644[0].next_in_room._4_1_ != '\0') &&
       (bVar5 = is_name(target_name,ch->name), !bVar5)) {
      pcVar14 = "You cannot call this power on another.\n\r";
      goto LAB_002da025;
    }
    goto LAB_002da249;
  case 4:
    if (local_3644[0].next_in_room._4_1_ == '\0') {
      pcVar14 = "What should the power be called upon?\n\r";
      goto LAB_002da025;
    }
    pCVar11 = (CHAR_DATA *)get_obj_carry(ch,target_name,ch);
    if (pCVar11 == (CHAR_DATA *)0x0) {
      pcVar14 = "You are not carrying that.\n\r";
      goto LAB_002da025;
    }
LAB_002da2c1:
    local_3650 = CONCAT71((int7)((ulong)pCVar11 >> 8),1);
    iVar6 = 1;
    goto LAB_002da2d1;
  case 5:
    if (local_3644[0].next_in_room._4_1_ != '\0') {
      victim = get_char_room(ch,target_name);
      if (victim != (CHAR_DATA *)0x0) goto LAB_002da346;
      pCVar11 = (CHAR_DATA *)get_obj_carry(ch,target_name,ch);
      if (pCVar11 == (CHAR_DATA *)0x0) goto LAB_002da41b;
      goto LAB_002da2c1;
    }
LAB_002da249:
    local_3650 = 0;
    iVar6 = 0;
LAB_002da2d1:
    victim = (CHAR_DATA *)0x0;
    break;
  case 6:
    local_3650 = CONCAT71(uVar12,1);
    if (local_3644[0].next_in_room._4_1_ == '\0') {
      victim = ch->fighting;
      bVar5 = true;
      if (victim == (CHAR_DATA *)0x0) {
        pcVar14 = "Call the power on who or what?\n\r";
        goto LAB_002da025;
      }
    }
    else {
      victim = get_char_room(ch,target_name);
      bVar5 = victim != (CHAR_DATA *)0x0;
    }
    if (bVar5) {
      bVar5 = is_affected_by(ch,0x12);
      local_3650 = 0;
      pCVar11 = victim;
      if (bVar5) {
        local_3650 = 0;
        iVar6 = 0;
        if (ch->master == victim) {
          pcVar14 = "You can\'t do that on your own follower.\n\r";
          goto LAB_002da025;
        }
      }
      else {
        iVar6 = 0;
      }
    }
    else {
      pCVar11 = (CHAR_DATA *)get_obj_here(ch,target_name);
      if (pCVar11 == (CHAR_DATA *)0x0) {
LAB_002da41b:
        pcVar14 = "You don\'t see that here.\n\r";
        goto LAB_002da025;
      }
      iVar6 = 1;
    }
    break;
  case 7:
    local_3644[0].next._0_4_ = direction_lookup(target_name);
    if (((int)local_3644[0].next < 0) ||
       (ch->in_room->exit[(int)local_3644[0].next] == (EXIT_DATA *)0x0)) {
      pcVar14 = "That\'s not a valid direction.\n\r";
      goto LAB_002da025;
    }
    local_3650 = CONCAT71((int7)(int3)((uint)(int)local_3644[0].next >> 8),1);
    iVar6 = 5;
    victim = (CHAR_DATA *)0x0;
    pCVar11 = local_3644;
    break;
  default:
    fmt._M_str = "Do_cast: bad target for sn {}.";
    fmt._M_len = 0x1e;
    CLogger::Warn<int&>((CLogger *)&RS.field_0x140,fmt,(int *)&local_3654);
    return;
  }
  bVar5 = is_npc(ch);
  if ((!bVar5) && ((int)ch->mana < (int)uVar13)) {
    pcVar14 = "You don\'t have enough mana.\n\r";
LAB_002da025:
    send_to_char(pcVar14,ch);
    return;
  }
  WAIT_STATE(ch,(int)skill_table[(int)local_3654].beats);
  bVar5 = is_npc(ch);
  if (!bVar5) {
    iVar7 = number_percent();
    local_3644[0]._4_8_ = victim;
    iVar8 = get_skill(ch,local_3654);
    victim = (CHAR_DATA *)local_3644[0]._4_8_;
    if (iVar8 < iVar7) {
      send_to_char("You lost your concentration.\n\r",ch);
      if (local_3654 != (int)gsn_rage) {
        check_improve(ch,local_3654,false,1);
      }
      ch->mana = ch->mana - (short)((uint)((int)(uVar13 >> 0x1f) + (int)uVar13) >> 1);
      goto LAB_002da614;
    }
  }
  ch->mana = ch->mana - (short)uVar13;
  if ((skill_table[(int)local_3654].target == 1) && (bVar5 = is_safe(ch,victim), bVar5)) {
    return;
  }
  if ((((skill_table[(int)local_3654].target == 1) && (bVar5 = is_npc(ch), !bVar5)) &&
      (bVar5 = is_npc(victim), !bVar5)) &&
     ((ch->fighting == (CHAR_DATA *)0x0 || (victim->fighting == (CHAR_DATA *)0x0)))) {
    uVar9 = number_range(0,2);
    if (uVar9 < 3) {
      iVar7 = *(int *)(&DAT_003b43a0 + (ulong)uVar9 * 4);
      pcVar14 = pers(ch,victim);
      sprintf(local_1238,&DAT_003b43a0 + iVar7,pcVar14);
    }
    if ((victim != ch) && (bVar5 = is_npc(ch), !bVar5)) {
      do_myell(victim,local_1238,ch);
    }
  }
  (*skill_table[(int)local_3654].spell_fun)(local_3654,(int)ch->level,ch,pCVar11,iVar6);
  check_improve(ch,local_3654,true,1);
LAB_002da614:
  if (victim == ch) {
    return;
  }
  if ((skill_table[(int)local_3654].target != 1 &
      ((byte)local_3650 | skill_table[(int)local_3654].target != 6)) != 0) {
    return;
  }
  if (victim->master == ch) {
    return;
  }
  un_blade_barrier(ch,(char *)0x0);
  pCVar11 = ch->in_room->people;
  do {
    if (pCVar11 == (CHAR_DATA *)0x0) {
      return;
    }
    ppCVar1 = &pCVar11->next_in_room;
    bVar5 = victim != pCVar11;
    pCVar11 = *ppCVar1;
  } while ((bVar5) || (victim->fighting != (CHAR_DATA *)0x0));
  multi_hit(victim,ch,-1);
  return;
}

Assistant:

void do_call(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	EXIT_DATA *pexit;
	void *vo;
	int mana, where;
	int sn;
	int target;

	if (is_npc(ch) && ch->desc == nullptr)
		return;

	target_name = one_argument(argument, arg1);

	one_argument(target_name, arg2);

	if (arg1[0] == '\0')
	{
		send_to_char("Call which what where?\n\r", ch);
		return;
	}

	sn = find_spell(ch, arg1);

	if (sn < 1
		|| skill_table[sn].spell_fun == spell_null
		|| (!is_npc(ch) && get_skill(ch, sn) < 5)
		|| (!is_npc(ch) && ch->pcdata->learned[sn] == 0))
	{
		send_to_char("You don't know any powers of that name.\n\r", ch);
		return;
	}

	if (ch->position < skill_table[sn].minimum_position && get_trust(ch) < MAX_LEVEL - 1)
	{
		send_to_char("You can't concentrate enough.\n\r", ch);
		return;
	}

	if (skill_table[sn].ctype != CMD_POWER && !is_immortal(ch))
	{
		send_to_char("You can't call that.\n\r", ch);
		return;
	}

	if (cabal_down(ch, ch->cabal))
		return;

	if (ch->level + 2 == skill_table[sn].skill_level[ch->Class()->GetIndex()])
		mana = 50;
	else
		mana = std::max((int)skill_table[sn].min_mana, 100 / (2 + ch->level - skill_table[sn].skill_level[ch->Class()->GetIndex()]));

	/*
	 * Locate targets.
	 */
	victim = nullptr;
	obj = nullptr;
	vo = nullptr;
	target = TARGET_NONE;

	switch (skill_table[sn].target)
	{
		case TAR_IGNORE:
			break;
		case TAR_CHAR_GENERAL:
		case TAR_CHAR_OFFENSIVE:
			if (arg2[0] == '\0')
			{
				victim = ch->fighting;

				if (victim == nullptr)
				{
					send_to_char("Call the power on whom?\n\r", ch);
					return;
				}
			}
			else
			{
				victim = get_char_room(ch, target_name);

				if (victim == nullptr)
				{
					send_to_char("They aren't here.\n\r", ch);
					return;
				}
			}

			if (is_affected_by(ch, AFF_CHARM) && ch->master == victim)
			{
				send_to_char("You can't do that on your own master.\n\r", ch);
				return;
			}

			vo = (void *)victim;
			target = TARGET_CHAR;
			break;
		case TAR_CHAR_DEFENSIVE:
			if (arg2[0] == '\0')
				victim = ch;
			else
			{
				victim = get_char_room(ch, target_name);

				if (victim == nullptr)
				{
					send_to_char("They aren't here.\n\r", ch);
					return;
				}
			}

			vo = (void *)victim;
			target = TARGET_CHAR;
			break;
		case TAR_CHAR_SELF:
			if (arg2[0] != '\0' && !is_name(target_name, ch->name))
			{
				send_to_char("You cannot call this power on another.\n\r", ch);
				return;
			}

			vo = (void *)ch;
			target = TARGET_CHAR;
			break;
		case TAR_OBJ_INV:
			if (arg2[0] == '\0')
			{
				send_to_char("What should the power be called upon?\n\r", ch);
				return;
			}

			obj = get_obj_carry(ch, target_name, ch);

			if (obj == nullptr)
			{
				send_to_char("You are not carrying that.\n\r", ch);
				return;
			}

			vo = (void *)obj;
			target = TARGET_OBJ;
			break;
		case TAR_OBJ_CHAR_OFF:
			if (arg2[0] == '\0')
			{
				victim = ch->fighting;

				if (victim == nullptr)
				{
					send_to_char("Call the power on who or what?\n\r", ch);
					return;
				}

				target = TARGET_CHAR;
			}
			else
			{
				victim = get_char_room(ch, target_name);

				if (victim != nullptr)
					target = TARGET_CHAR;
			}

			if (target == TARGET_CHAR) /* check the sanity of the attack */
			{
				if (is_affected_by(ch, AFF_CHARM) && ch->master == victim)
				{
					send_to_char("You can't do that on your own follower.\n\r", ch);
					return;
				}

				vo = (void *)victim;
			}
			else if ((obj = get_obj_here(ch, target_name)) != nullptr)
			{
				vo = (void *)obj;
				target = TARGET_OBJ;
			}
			else
			{
				send_to_char("You don't see that here.\n\r", ch);
				return;
			}

			break;
		case TAR_OBJ_CHAR_DEF:
			if (arg2[0] == '\0')
			{
				vo = (void *)ch;
				target = TARGET_CHAR;
			}
			else if ((victim = get_char_room(ch, target_name)) != nullptr)
			{
				vo = (void *)victim;
				target = TARGET_CHAR;
			}
			else if ((obj = get_obj_carry(ch, target_name, ch)) != nullptr)
			{
				vo = (void *)obj;
				target = TARGET_OBJ;
			}
			else
			{
				send_to_char("You don't see that here.\n\r", ch);
				return;
			}

			break;
		case TAR_DIR:
			where = direction_lookup(target_name);
			pexit = ch->in_room->exit[where];

			if (where < 0 || !pexit)
			{
				send_to_char("That's not a valid direction.\n\r", ch);
				return;
			}

			vo = &where;
			target = TARGET_DIR;
			break;
		default:
			RS.Logger.Warn("Do_cast: bad target for sn {}.", sn);
			return;
	}

	if (!is_npc(ch) && ch->mana < mana)
	{
		send_to_char("You don't have enough mana.\n\r", ch);
		return;
	}

	WAIT_STATE(ch, skill_table[sn].beats);

	if (!is_npc(ch) && (number_percent() > get_skill(ch, sn)))
	{
		send_to_char("You lost your concentration.\n\r", ch);

		if (sn != gsn_rage)
			check_improve(ch, sn, false, 1);

		ch->mana -= mana / 2;
	}
	else
	{
		ch->mana -= mana;

		if (skill_table[sn].target == TAR_CHAR_OFFENSIVE && is_safe(ch, victim))
			return;

		if (skill_table[sn].target == TAR_CHAR_OFFENSIVE)
		{
			if (!is_npc(ch) && !is_npc(victim) && (ch->fighting == nullptr || victim->fighting == nullptr))
			{
				switch (number_range(0, 2))
				{
					case 0:
					case 1:
						sprintf(buf, "Die, %s you sorcerous dog!", pers(ch, victim));
						break;
					case 2:
						sprintf(buf, "Help! %s is casting a spell on me!", pers(ch, victim));
						break;
				}

				if (victim != ch && !is_npc(ch))
					do_myell(victim, buf, ch);
			}

			if (check_volley(ch, victim))
			{
				act("$N reflects your spell right back at you!", ch, 0, victim, TO_CHAR);
				act("You reflect $n's spell right back at $m!", ch, 0, victim, TO_VICT);
				act("$N reflects $n's spell right back at $m!", ch, 0, victim, TO_NOTVICT);
				(*skill_table[sn].spell_fun)(sn, ch->level * 2, victim, ch, target);
				return;
			}
		}

		(*skill_table[sn].spell_fun)(sn, ch->level, ch, vo, target);
		check_improve(ch, sn, true, 1);
	}

	if ((skill_table[sn].target == TAR_CHAR_OFFENSIVE
			|| (skill_table[sn].target == TAR_OBJ_CHAR_OFF && target == TARGET_CHAR))
		&& victim != ch
		&& victim->master != ch)
	{
		CHAR_DATA *vch;
		CHAR_DATA *vch_next;
		un_blade_barrier(ch, nullptr);

		for (vch = ch->in_room->people; vch; vch = vch_next)
		{
			vch_next = vch->next_in_room;

			if (victim == vch && victim->fighting == nullptr)
			{
				multi_hit(victim, ch, TYPE_UNDEFINED);
				break;
			}
		}
	}
}